

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

int amqpvalue_get_error(AMQP_VALUE value,ERROR_HANDLE *error_handle)

{
  int iVar1;
  AMQP_TYPE AVar2;
  int iVar3;
  ERROR_HANDLE pEVar4;
  AMQP_VALUE pAVar5;
  AMQP_VALUE pAVar6;
  uint32_t list_item_count;
  char *condition;
  
  pEVar4 = (ERROR_HANDLE)malloc(8);
  if (pEVar4 == (ERROR_HANDLE)0x0) {
    *error_handle = (ERROR_HANDLE)0x0;
    iVar3 = 0xe5;
  }
  else {
    pEVar4->composite_value = (AMQP_VALUE)0x0;
    *error_handle = pEVar4;
    pAVar5 = amqpvalue_get_inplace_described_value(value);
    if (pAVar5 == (AMQP_VALUE)0x0) {
      error_destroy(*error_handle);
      iVar3 = 0xed;
    }
    else {
      iVar1 = amqpvalue_get_list_item_count(pAVar5,&list_item_count);
      iVar3 = 0xf4;
      if (iVar1 == 0) {
        if (list_item_count == 0) {
          iVar3 = 0x121;
        }
        else {
          pAVar6 = amqpvalue_get_list_item(pAVar5,0);
          if (pAVar6 == (AMQP_VALUE)0x0) {
            error_destroy(*error_handle);
            iVar3 = 0x103;
          }
          else {
            AVar2 = amqpvalue_get_type(pAVar6);
            if (AVar2 == AMQP_TYPE_NULL) {
              amqpvalue_destroy(pAVar6);
              error_destroy(*error_handle);
              iVar3 = 0x10d;
            }
            else {
              iVar3 = amqpvalue_get_symbol(pAVar6,&condition);
              if (iVar3 == 0) {
                amqpvalue_destroy(pAVar6);
                if (1 < list_item_count) {
                  pAVar6 = amqpvalue_get_list_item(pAVar5,1);
                  if (pAVar6 != (AMQP_VALUE)0x0) {
                    AVar2 = amqpvalue_get_type(pAVar6);
                    if ((AVar2 != AMQP_TYPE_NULL) &&
                       (iVar3 = amqpvalue_get_string(pAVar6,&condition), iVar3 != 0)) {
                      amqpvalue_destroy(pAVar6);
                      error_destroy(*error_handle);
                      return 0x139;
                    }
                    amqpvalue_destroy(pAVar6);
                  }
                  if ((2 < list_item_count) &&
                     (pAVar5 = amqpvalue_get_list_item(pAVar5,2), pAVar5 != (AMQP_VALUE)0x0)) {
                    AVar2 = amqpvalue_get_type(pAVar5);
                    if ((AVar2 != AMQP_TYPE_NULL) &&
                       (iVar3 = amqpvalue_get_map(pAVar5,(AMQP_VALUE *)&condition), iVar3 != 0)) {
                      amqpvalue_destroy(pAVar5);
                      error_destroy(*error_handle);
                      return 0x156;
                    }
                    amqpvalue_destroy(pAVar5);
                  }
                }
                pAVar5 = amqpvalue_clone(value);
                pEVar4->composite_value = pAVar5;
                iVar3 = 0;
              }
              else {
                amqpvalue_destroy(pAVar6);
                error_destroy(*error_handle);
                iVar3 = 0x117;
              }
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int amqpvalue_get_error(AMQP_VALUE value, ERROR_HANDLE* error_handle)
{
    int result;
    ERROR_INSTANCE* error_instance = (ERROR_INSTANCE*)error_create_internal();
    *error_handle = error_instance;
    if (*error_handle == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE list_value = amqpvalue_get_inplace_described_value(value);
        if (list_value == NULL)
        {
            error_destroy(*error_handle);
            result = MU_FAILURE;
        }
        else
        {
            uint32_t list_item_count;
            if (amqpvalue_get_list_item_count(list_value, &list_item_count) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                do
                {
                    AMQP_VALUE item_value;
                    /* condition */
                    if (list_item_count > 0)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 0);
                        if (item_value == NULL)
                        {
                            {
                                error_destroy(*error_handle);
                                result = MU_FAILURE;
                                break;
                            }
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                amqpvalue_destroy(item_value);
                                error_destroy(*error_handle);
                                result = MU_FAILURE;
                                break;
                            }
                            else
                            {
                                const char* condition;
                                if (amqpvalue_get_symbol(item_value, &condition) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    error_destroy(*error_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    else
                    {
                        result = MU_FAILURE;
                        break;
                    }
                    /* description */
                    if (list_item_count > 1)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 1);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                const char* description;
                                if (amqpvalue_get_string(item_value, &description) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    error_destroy(*error_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* info */
                    if (list_item_count > 2)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 2);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                fields info;
                                if (amqpvalue_get_fields(item_value, &info) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    error_destroy(*error_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }

                    error_instance->composite_value = amqpvalue_clone(value);

                    result = 0;
                } while(0);
            }
        }
    }

    return result;
}